

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O0

ion_file_handle_t ion_fopen(char *name)

{
  FILE *local_18;
  ion_file_handle_t file;
  char *name_local;
  
  local_18 = fopen(name,"r+b");
  if (local_18 == (FILE *)0x0) {
    local_18 = fopen(name,"w+b");
  }
  return (ion_file_handle_t)local_18;
}

Assistant:

ion_file_handle_t
ion_fopen(
	char *name
) {
#if defined(ARDUINO)

	ion_file_handle_t toret;

	toret.file = fopen(name, "r+");

	if (NULL == toret.file) {
		toret.file = fopen(name, "w+");
	}

	return toret;
#else

	ion_file_handle_t file;

	file = fopen(name, "r+b");

	if (NULL == file) {
		file = fopen(name, "w+b");
	}

	return file;
#endif
}